

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_formatter.cpp
# Opt level: O2

string * lwlog::details::alignment_formatter::align_center
                   (string *__return_storage_ptr__,string *to_align,uint8_t width,char fill_char)

{
  undefined7 in_register_00000011;
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = CONCAT71(in_register_00000011,width) & 0xffffffff;
  uVar3 = uVar2 - to_align->_M_string_length;
  if (uVar2 < to_align->_M_string_length || uVar3 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)to_align);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    cVar1 = (char)(uVar3 >> 1);
    std::__cxx11::string::append((ulong)__return_storage_ptr__,cVar1);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((ulong)__return_storage_ptr__,(char)uVar3 - cVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string alignment_formatter::align_center(const std::string& to_align, std::uint8_t width, char fill_char)
	{
		if (width <= to_align.size()) return to_align;

		const auto total_padding{ width - to_align.size()		};
		const auto padding_left	{ total_padding / 2				};
		const auto padding_right{ total_padding - padding_left	};

		std::string result;
		result.reserve(width);

		result.append(padding_left, fill_char);
		result.append(to_align);
		result.append(padding_right, fill_char);

		return result;
	}